

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::visitDestructuringDecl(CheckerVisitor *this,DestructuringDecl *d)

{
  int iVar1;
  uint uVar2;
  Expr *pEVar3;
  VarDecl **ppVVar4;
  SQArray *this_00;
  SQTable *this_01;
  VarDecl *pVVar5;
  char *__s;
  mapped_type pVVar6;
  SQClass *this_02;
  SQInstance *this_03;
  bool bVar7;
  ValueRef *pVVar8;
  SQChar *pSVar9;
  size_t keylen;
  mapped_type *ppVVar10;
  long lVar11;
  long lVar12;
  SQObjectPtr val_1;
  SQObjectPtr val;
  VarDecl *local_38;
  
  checkAccessNullable(this,d);
  (*(this->super_Visitor)._vptr_Visitor[0x29])(this,d);
  pVVar8 = findValueForExpr(this,d->_expr);
  if ((((pVVar8 != (ValueRef *)0x0) && (pVVar8->state - VRS_EXPRESSION < 2)) &&
      (pEVar3 = pVVar8->expression, pEVar3 != (Expr *)0x0)) &&
     ((pEVar3->super_Node)._op == TO_EXTERNAL_VALUE)) {
    iVar1 = *(int *)&pEVar3[1].super_Node.super_ArenaObj._vptr_ArenaObj;
    if (iVar1 == 0xa008000) {
      if (d->_dt_type == DT_TABLE) {
        this_03 = *(SQInstance **)&pEVar3[1].super_Node._coordinates;
        ppVVar4 = (d->super_DeclGroup)._decls._vals;
        uVar2 = (d->super_DeclGroup)._decls._size;
        for (lVar11 = 0; (ulong)uVar2 << 3 != lVar11; lVar11 = lVar11 + 8) {
          pVVar5 = *(VarDecl **)((long)ppVVar4 + lVar11);
          SQObjectPtr::SQObjectPtr(&val,this->_ctx->_vm,(pVVar5->super_ValueDecl)._name,-1);
          val_1.super_SQObject._unVal.pTable = (SQTable *)0x0;
          val_1.super_SQObject._type = OT_NULL;
          val_1.super_SQObject._flags = '\0';
          val_1.super_SQObject._5_3_ = 0;
          bVar7 = SQInstance::Get(this_03,&val,&val_1);
          if (bVar7) {
            local_38 = pVVar5;
            ppVVar10 = std::__detail::
                       _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->astValues,(key_type *)&local_38);
            pVVar6 = *ppVVar10;
            pVVar6->state = VRS_INITIALIZED;
            pVVar8 = addExternalValue(this,&val_1.super_SQObject,(Node *)pVVar5);
            pVVar6->expression = pVVar8->expression;
          }
          else {
            checkDestructuredVarDefault(this,pVVar5);
          }
          SQObjectPtr::~SQObjectPtr(&val_1);
          SQObjectPtr::~SQObjectPtr(&val);
        }
        return;
      }
      pSVar9 = "instance";
    }
    else if (iVar1 == 0x8000040) {
      if (d->_dt_type == DT_ARRAY) {
        this_00 = *(SQArray **)&pEVar3[1].super_Node._coordinates;
        ppVVar4 = (d->super_DeclGroup)._decls._vals;
        lVar11 = 0;
        for (lVar12 = (ulong)(d->super_DeclGroup)._decls._size << 3; lVar12 != 0;
            lVar12 = lVar12 + -8) {
          pVVar5 = ppVVar4[lVar11];
          val.super_SQObject._unVal.pTable = (SQTable *)0x0;
          val.super_SQObject._type = OT_NULL;
          val.super_SQObject._flags = '\0';
          val.super_SQObject._5_3_ = 0;
          bVar7 = SQArray::Get(this_00,lVar11,&val);
          if (bVar7) {
            val_1.super_SQObject._0_8_ = pVVar5;
            ppVVar10 = std::__detail::
                       _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->astValues,(key_type *)&val_1);
            pVVar6 = *ppVVar10;
            pVVar6->state = VRS_INITIALIZED;
            pVVar8 = addExternalValue(this,&val.super_SQObject,(Node *)pVVar5);
            pVVar6->expression = pVVar8->expression;
          }
          else {
            checkDestructuredVarDefault(this,pVVar5);
          }
          lVar11 = lVar11 + 1;
          SQObjectPtr::~SQObjectPtr(&val);
        }
        return;
      }
      pSVar9 = "array";
    }
    else if (iVar1 == 0x8004000) {
      if (d->_dt_type == DT_TABLE) {
        this_02 = *(SQClass **)&pEVar3[1].super_Node._coordinates;
        ppVVar4 = (d->super_DeclGroup)._decls._vals;
        uVar2 = (d->super_DeclGroup)._decls._size;
        for (lVar11 = 0; (ulong)uVar2 << 3 != lVar11; lVar11 = lVar11 + 8) {
          pVVar5 = *(VarDecl **)((long)ppVVar4 + lVar11);
          SQObjectPtr::SQObjectPtr(&val,this->_ctx->_vm,(pVVar5->super_ValueDecl)._name,-1);
          val_1.super_SQObject._unVal.pTable = (SQTable *)0x0;
          val_1.super_SQObject._type = OT_NULL;
          val_1.super_SQObject._flags = '\0';
          val_1.super_SQObject._5_3_ = 0;
          bVar7 = SQClass::Get(this_02,&val,&val_1);
          if (bVar7) {
            local_38 = pVVar5;
            ppVVar10 = std::__detail::
                       _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->astValues,(key_type *)&local_38);
            pVVar6 = *ppVVar10;
            pVVar6->state = VRS_INITIALIZED;
            pVVar8 = addExternalValue(this,&val_1.super_SQObject,(Node *)pVVar5);
            pVVar6->expression = pVVar8->expression;
          }
          else {
            checkDestructuredVarDefault(this,pVVar5);
          }
          SQObjectPtr::~SQObjectPtr(&val_1);
          SQObjectPtr::~SQObjectPtr(&val);
        }
        return;
      }
      pSVar9 = "class";
    }
    else if (iVar1 == 0xa000020) {
      if (d->_dt_type == DT_TABLE) {
        this_01 = *(SQTable **)&pEVar3[1].super_Node._coordinates;
        ppVVar4 = (d->super_DeclGroup)._decls._vals;
        uVar2 = (d->super_DeclGroup)._decls._size;
        for (lVar11 = 0; (ulong)uVar2 << 3 != lVar11; lVar11 = lVar11 + 8) {
          pVVar5 = *(VarDecl **)((long)ppVVar4 + lVar11);
          val.super_SQObject._unVal.pTable = (SQTable *)0x0;
          val.super_SQObject._type = OT_NULL;
          val.super_SQObject._flags = '\0';
          val.super_SQObject._5_3_ = 0;
          __s = (pVVar5->super_ValueDecl)._name;
          keylen = strlen(__s);
          bVar7 = SQTable::GetStr(this_01,__s,keylen,(SQObjectPtr *)&val.super_SQObject);
          if (bVar7) {
            val_1.super_SQObject._0_8_ = pVVar5;
            ppVVar10 = std::__detail::
                       _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->astValues,(key_type *)&val_1);
            pVVar6 = *ppVVar10;
            pVVar6->state = VRS_INITIALIZED;
            pVVar8 = addExternalValue(this,&val.super_SQObject,(Node *)pVVar5);
            pVVar6->expression = pVVar8->expression;
          }
          else {
            checkDestructuredVarDefault(this,pVVar5);
          }
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&val.super_SQObject);
        }
        return;
      }
      pSVar9 = "table";
    }
    else {
      if (iVar1 == 0x1000001) {
        ppVVar4 = (d->super_DeclGroup)._decls._vals;
        uVar2 = (d->super_DeclGroup)._decls._size;
        for (lVar11 = 0; (ulong)uVar2 << 3 != lVar11; lVar11 = lVar11 + 8) {
          checkDestructuredVarDefault(this,*(VarDecl **)((long)ppVVar4 + lVar11));
        }
        return;
      }
      pSVar9 = GetTypeName((SQObjectPtr *)(pEVar3 + 1));
    }
    report(this,(Node *)d,0x8d,pSVar9);
    return;
  }
  return;
}

Assistant:

void CheckerVisitor::visitDestructuringDecl(DestructuringDecl *d) {

  checkAccessNullable(d);

  Visitor::visitDestructuringDecl(d);

  if (auto v = findValueForExpr(d->initExpression()); v && v->hasValue() && v->expression) {
    if (v->expression->op() == TO_EXTERNAL_VALUE) {
      const auto &init = v->expression->asExternal()->value();
      if (sq_isnull(init)) {
        for (auto var : d->declarations()) {
          checkDestructuredVarDefault(var);
        }
      }
      else if (sq_istable(init)) {
        if (d->type() == DT_TABLE) {
          auto table = _table(init);
          for (auto var : d->declarations()) {
            SQObjectPtr val;
            if (table->GetStr(var->name(), strlen(var->name()), val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "table");
        }
      }
      else if (sq_isclass(init)) {
        if (d->type() == DT_TABLE) {
          auto klass = _class(init);
          for (auto var : d->declarations()) {
            SQObjectPtr key(_ctx.getVm(), var->name());
            SQObjectPtr val;
            if (klass->Get(key, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "class");
        }
      }
      else if (sq_isinstance(init)) {
        if (d->type() == DT_TABLE) {
          auto inst = _instance(init);
          for (auto var : d->declarations()) {
            SQObjectPtr key(_ctx.getVm(), var->name());
            SQObjectPtr val;
            if (inst->Get(key, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "instance");
        }
      }
      else if (sq_isarray(init)) {
        if (d->type() == DT_ARRAY) {
          auto array = _array(init);
          SQInteger index = 0;
          for (auto var : d->declarations()) {
            SQObjectPtr val;
            if (array->Get(index, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
            index++;
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "array");
        }
      }
      else {
        report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, GetTypeName(init));
      }
    }
    else if (v->expression->op() == TO_TABLE) {
      // TODO: check table destructuring
    }
    else if (v->expression->op() == TO_ARRAYEXPR) {
      // TODO: check array destructuring
    }
  }
}